

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

void __thiscall embree::XMLLoader::~XMLLoader(XMLLoader *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    fclose(*(FILE **)(in_RDI + 0x20));
  }
  if (*(long *)(in_RDI + 0xc0) != 0) {
    (**(code **)(**(long **)(in_RDI + 0xc0) + 0x18))();
  }
  std::
  map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  ::~map((map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
          *)0x3ba23a);
  std::
  map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  ::~map((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
          *)0x3ba248);
  embree::FileName::~FileName((FileName *)0x3ba256);
  embree::FileName::~FileName((FileName *)0x3ba260);
  return;
}

Assistant:

XMLLoader::~XMLLoader() {
    if (binFile) fclose(binFile);
  }